

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datatypes.hpp
# Opt level: O2

MPI_Datatype mxx::datatype_builder<std::pair<int,_double>_>::get_type(void)

{
  long __tmp;
  MPI_Datatype types [2];
  long local_78;
  long local_70;
  int blocklen [2];
  MPI_Datatype struct_type;
  MPI_Aint t2_adr;
  MPI_Aint t1_adr;
  MPI_Aint p_adr;
  pair<int,_double> p;
  MPI_Datatype _type;
  
  p.first = 0;
  blocklen[0] = 1;
  blocklen[1] = 1;
  p.second = 0.0;
  MPI_Get_address(&p,&p_adr);
  MPI_Get_address(&p,&t1_adr);
  MPI_Get_address(&p.second,&t2_adr);
  types[0] = (MPI_Datatype)&ompi_mpi_int;
  types[1] = (MPI_Datatype)&ompi_mpi_double;
  local_78 = t1_adr - p_adr;
  local_70 = t2_adr - p_adr;
  if (t2_adr < t1_adr) {
    types[0] = (MPI_Datatype)&ompi_mpi_double;
    types[1] = (MPI_Datatype)&ompi_mpi_int;
    local_78 = t2_adr - p_adr;
    local_70 = t1_adr - p_adr;
  }
  MPI_Type_create_struct(2,blocklen,&local_78,types,&struct_type);
  MPI_Type_create_resized(struct_type,0,0x10,&_type);
  MPI_Type_commit(&_type);
  MPI_Type_free(&struct_type);
  return _type;
}

Assistant:

static MPI_Datatype get_type() {
        MPI_Datatype _type;

        int blocklen[2] = {1, 1};
        MPI_Aint displs[2] = {0,0};
        // get actual displacement (in case of padding in the structure)
        std::pair<T1, T2> p;
        MPI_Aint p_adr, t1_adr, t2_adr;
        MPI_Get_address(&p, &p_adr);
        MPI_Get_address(&p.first, &t1_adr);
        MPI_Get_address(&p.second, &t2_adr);
        displs[0] = t1_adr - p_adr;
        displs[1] = t2_adr - p_adr;

        // create type
        // TODO: use cached type!
        MPI_Datatype types[2] = {datatype_builder<T1>::get_type(), datatype_builder<T2>::get_type()};
        // in case elements are represented the opposite way around in
        // the pair (gcc does so), then swap them
        if (displs[0] > displs[1]) {
            std::swap(displs[0], displs[1]);
            std::swap(types[0], types[1]);
        }
        // create MPI_Datatype (resized to actual sizeof())
        MPI_Datatype struct_type;
        MPI_Type_create_struct(2, blocklen, displs, types, &struct_type);
        MPI_Type_create_resized(struct_type, 0, sizeof(p), &_type);
        MPI_Type_commit(&_type);
        MPI_Type_free(&struct_type);
        return _type;
    }